

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::shaderVarValueStr_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,VarValue *value)

{
  uint uVar1;
  VarValue *__return_storage_ptr___00;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  uint extraout_EDX;
  uint precision;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar6;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  VarValue *value_00;
  ulong uVar7;
  ulong uVar8;
  VarValue *pVVar9;
  long lVar10;
  undefined1 local_210 [104];
  ostringstream result;
  
  uVar3 = glu::getDataTypeScalarSize(*(DataType *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  uVar6 = extraout_RDX;
  if (1 < (int)uVar3) {
    pcVar4 = glu::getDataTypeName(*(DataType *)this);
    poVar5 = std::operator<<((ostream *)&result,pcVar4);
    std::operator<<(poVar5,"(");
    uVar6 = extraout_RDX_00;
  }
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  lVar10 = 4;
  __return_storage_ptr___00 = (VarValue *)(local_210 + 0x20);
  do {
    precision = (uint)uVar6;
    if (uVar7 == uVar8) {
      if (1 < (int)uVar3) {
        std::operator<<((ostream *)&result,")");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
      return __return_storage_ptr__;
    }
    if (uVar8 != 0) {
      std::operator<<((ostream *)&result,", ");
      precision = extraout_EDX;
    }
    iVar2 = *(int *)this;
    pVVar9 = __return_storage_ptr___00;
    if (iVar2 - 1U < 4) {
LAB_00389686:
      de::floatToString_abi_cxx11_
                ((string *)__return_storage_ptr___00,(de *)0x2,*(float *)(this + uVar8 * 4 + 4),
                 precision);
      std::operator<<((ostream *)&result,(string *)__return_storage_ptr___00);
LAB_003896a6:
      std::__cxx11::string::~string((string *)pVVar9);
      uVar6 = extraout_RDX_01;
    }
    else {
      uVar1 = iVar2 - 0x12;
      precision = CONCAT31((int3)(uVar1 >> 8),8 < uVar1);
      uVar6 = (ulong)precision;
      if (iVar2 - 5U < 9 || 8 >= uVar1) goto LAB_00389686;
      if (iVar2 - 0x1bU < 4) {
        de::toString<int>((string *)__return_storage_ptr___00,(int *)(this + lVar10));
        std::operator<<((ostream *)&result,(string *)__return_storage_ptr___00);
        goto LAB_003896a6;
      }
      if (iVar2 - 0x23U < 4) {
        pcVar4 = "false";
        if (this[uVar8 + 4] != (Functional)0x0) {
          pcVar4 = "true";
        }
        std::operator<<((ostream *)&result,pcVar4);
        uVar6 = extraout_RDX_02;
      }
      else if (iVar2 - 0x27U < 0x1e) {
        getSamplerFillValue(__return_storage_ptr___00,(VarValue *)this);
        shaderVarValueStr_abi_cxx11_
                  ((string *)local_210,(Functional *)__return_storage_ptr___00,value_00);
        std::operator<<((ostream *)&result,(string *)local_210);
        pVVar9 = (VarValue *)local_210;
        goto LAB_003896a6;
      }
    }
    uVar8 = uVar8 + 1;
    lVar10 = lVar10 + 4;
  } while( true );
}

Assistant:

static string shaderVarValueStr (const VarValue& value)
{
	const int			numElems = glu::getDataTypeScalarSize(value.type);
	std::ostringstream	result;

	if (numElems > 1)
		result << glu::getDataTypeName(value.type) << "(";

	for (int i = 0; i < numElems; i++)
	{
		if (i > 0)
			result << ", ";

		if (glu::isDataTypeFloatOrVec(value.type) || glu::isDataTypeMatrix(value.type))
			result << de::floatToString(value.val.floatV[i], 2);
		else if (glu::isDataTypeIntOrIVec((value.type)))
			result << de::toString(value.val.intV[i]);
		else if (glu::isDataTypeBoolOrBVec((value.type)))
			result << (value.val.boolV[i] ? "true" : "false");
		else if (glu::isDataTypeSampler((value.type)))
			result << shaderVarValueStr(getSamplerFillValue(value));
		else
			DE_ASSERT(false);
	}

	if (numElems > 1)
		result << ")";

	return result.str();
}